

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O0

pair<bool,_bool> __thiscall
helics::TimeCoordinator::checkAndSendTimeRequest
          (TimeCoordinator *this,ActionMessage *upd,GlobalFederateId skipFed)

{
  byte bVar1;
  bool bVar2;
  int32_t iVar3;
  undefined4 in_EDX;
  ActionMessage *in_RSI;
  ActionMessage *in_RDI;
  GlobalFederateId unaff_retaddr;
  bool changed;
  bool local_2e;
  bool local_2d [7];
  bool local_26;
  bool local_25;
  GlobalFederateId local_24;
  GlobalFederateId local_20;
  byte local_19;
  ActionMessage *local_18;
  ActionMessage *msg;
  undefined2 in_stack_fffffffffffffffc;
  pair<bool,_bool> in_stack_fffffffffffffffe;
  
  local_19 = 0;
  local_18 = in_RSI;
  msg = in_RDI;
  bVar2 = TimeRepresentation<count_time<9,_long>_>::operator!=
                    (&in_RDI[1].Tdemin,&in_RSI->actionTime);
  if (bVar2) {
    local_19 = 1;
  }
  bVar2 = TimeRepresentation<count_time<9,_long>_>::operator!=
                    ((TimeRepresentation<count_time<9,_long>_> *)&in_RDI[1].payload,
                     &local_18->Tdemin);
  if (bVar2) {
    local_19 = 1;
  }
  bVar2 = TimeRepresentation<count_time<9,_long>_>::operator!=(&in_RDI[1].Tso,&local_18->Te);
  if (bVar2) {
    local_19 = 1;
  }
  iVar3 = ActionMessage::getExtraData((ActionMessage *)0x551a51);
  GlobalFederateId::GlobalFederateId(&local_20,iVar3);
  bVar2 = GlobalFederateId::operator!=
                    ((GlobalFederateId *)(in_RDI[1].payload.buffer._M_elems + 0x18),local_20);
  if (bVar2) {
    local_19 = 1;
  }
  if (in_RDI[1].payload.buffer._M_elems[0x20] != 8) {
    local_19 = 1;
  }
  if (*(int *)(in_RDI[1].payload.buffer._M_elems + 0x2c) !=
      *(int *)((in_RDI->payload).buffer._M_elems + 0xc)) {
    local_19 = 1;
  }
  bVar1 = in_RDI[1].payload.buffer._M_elems[0x22];
  bVar2 = checkActionFlag<helics::ActionMessage,helics::TimingFlags>(local_18,interrupted_flag);
  if ((bool)(bVar1 & 1) != bVar2) {
    local_19 = 1;
  }
  if ((local_19 & 1) == 0) {
    local_2d[0] = false;
    local_2e = false;
    CLI::std::pair<bool,_bool>::pair<bool,_bool,_true>
              ((pair<bool,_bool> *)&stack0xfffffffffffffffe,local_2d,&local_2e);
  }
  else {
    in_RDI[1].Tdemin.internalTimeCode = (local_18->actionTime).internalTimeCode;
    *(baseType *)in_RDI[1].payload.buffer._M_elems = (local_18->Tdemin).internalTimeCode;
    in_RDI[1].Tso.internalTimeCode = (local_18->Te).internalTimeCode;
    *(undefined4 *)(in_RDI[1].payload.buffer._M_elems + 0x2c) =
         *(undefined4 *)((in_RDI->payload).buffer._M_elems + 0xc);
    iVar3 = ActionMessage::getExtraData((ActionMessage *)0x551b29);
    GlobalFederateId::GlobalFederateId(&local_24,iVar3);
    *(BaseType *)(in_RDI[1].payload.buffer._M_elems + 0x18) = local_24.gid;
    in_RDI[1].payload.buffer._M_elems[0x20] = 8;
    bVar2 = checkActionFlag<helics::ActionMessage,helics::TimingFlags>(local_18,interrupted_flag);
    in_RDI[1].payload.buffer._M_elems[0x22] = bVar2;
    local_25 = true;
    local_26 = transmitTimingMessages
                         ((TimeCoordinator *)
                          CONCAT26(in_stack_fffffffffffffffe,
                                   CONCAT24(in_stack_fffffffffffffffc,in_EDX)),msg,unaff_retaddr);
    CLI::std::pair<bool,_bool>::pair<bool,_bool,_true>
              ((pair<bool,_bool> *)&stack0xfffffffffffffffe,&local_25,&local_26);
  }
  return in_stack_fffffffffffffffe;
}

Assistant:

std::pair<bool, bool> TimeCoordinator::checkAndSendTimeRequest(ActionMessage& upd,
                                                               GlobalFederateId skipFed) const
{
    bool changed{false};
    if (lastSend.next != upd.actionTime) {
        changed = true;
    }
    if (lastSend.minDe != upd.Tdemin) {
        changed = true;
    }
    if (lastSend.Te != upd.Te) {
        changed = true;
    }
    if (lastSend.minFed != GlobalFederateId(upd.getExtraData())) {
        changed = true;
    }
    if (lastSend.mTimeState != TimeState::time_requested) {
        changed = true;
    }
    if (lastSend.sequenceCounter != sequenceCounter) {
        changed = true;
    }
    if (lastSend.interrupted != checkActionFlag(upd, interrupted_flag)) {
        changed = true;
    }
    if (changed) {
        lastSend.next = upd.actionTime;
        lastSend.minDe = upd.Tdemin;
        lastSend.Te = upd.Te;
        lastSend.sequenceCounter = sequenceCounter;
        lastSend.minFed = GlobalFederateId(upd.getExtraData());
        lastSend.mTimeState = TimeState::time_requested;
        lastSend.interrupted = checkActionFlag(upd, interrupted_flag);
        return {true, transmitTimingMessages(upd, skipFed)};
    }
    return {false, false};
}